

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O2

void __thiscall
Js::ProbeContainer::UpdateFramePointers
          (ProbeContainer *this,bool fMatchWithCurrentScriptContext,
          DWORD_PTR dispatchHaltFrameAddress)

{
  List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint32 byteCodeOffset;
  BOOL BVar4;
  ReferencedArenaAdapter *pRVar5;
  DiagStack *pDVar6;
  List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  InterpreterStackFrame *this_02;
  ScriptContext *this_03;
  void **ppvVar7;
  DiagNativeStackFrame *pDVar8;
  JavascriptFunction *pJVar9;
  ScriptFunction *function;
  void *codeAddr;
  PCWSTR displayName;
  ulong uVar10;
  short sVar11;
  undefined7 in_register_00000031;
  undefined1 local_118 [8];
  JavascriptStackWalker walker;
  JavascriptFunction *local_60;
  ProbeContainer *local_58;
  void **local_50;
  ArenaAllocator *local_48;
  DiagNativeStackFrame *local_40;
  undefined4 local_38;
  char local_31;
  
  local_38 = (undefined4)CONCAT71(in_register_00000031,fMatchWithCurrentScriptContext);
  local_50 = (void **)dispatchHaltFrameAddress;
  pRVar5 = DebugManager::GetDiagnosticArena(this->debugManager);
  local_48 = (ArenaAllocator *)0x0;
  if (pRVar5->deleteFlag == false) {
    local_48 = pRVar5->arena;
  }
  pDVar6 = (DiagStack *)new<Memory::ArenaAllocator>(0x30,local_48,0x35916e);
  (pDVar6->list).super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>.
  alloc = local_48;
  (pDVar6->list).super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_0136cf38;
  (pDVar6->list).super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>.
  buffer = (Type)0x0;
  (pDVar6->list).super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>.
  count = 0;
  (pDVar6->list).length = 0;
  (pDVar6->list).increment = 4;
  this->framePointers = pDVar6;
  JavascriptStackWalker::JavascriptStackWalker
            ((JavascriptStackWalker *)local_118,this->pScriptContext,(bool)((byte)local_38 ^ 1),
             (PVOID)0x0,true);
  this_01 = (List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::ArenaAllocator>(0x30,local_48,0x35916e);
  (this_01->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).alloc
       = local_48;
  (this_01->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_0136cf38;
  (this_01->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
  buffer = (Type)0x0;
  (this_01->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).count
       = 0;
  this_01->length = 0;
  this_01->increment = 4;
  local_58 = this;
  local_31 = IsLibraryStackFrameSupportEnabled(this);
  uVar3 = JavascriptStackWalker::GetNonLibraryCodeCaller
                    ((JavascriptStackWalker *)local_118,&local_60);
  walker.currentFrame.stackCheckCodeHeight = __tls_get_addr(&PTR_013e5f18);
  sVar11 = 0;
  do {
    if (uVar3 == 0) {
      uVar10 = (ulong)(uint)(this_01->
                            super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>
                            ).count;
LAB_007fc9b2:
      Output::Trace(DebuggerPhase,
                    L"ProbeContainer::UpdateFramePointers: detected %d frames (this=%p, fMatchWithCurrentScriptContext=%d)\n"
                    ,uVar10,local_58,(ulong)(byte)local_38);
      while ((this_01->
             super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
             count != 0) {
        this_00 = &local_58->framePointers->list;
        local_40 = (DiagNativeStackFrame *)
                   JsUtil::
                   Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
                             ((Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>
                               *)this_01);
        JsUtil::
        List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(this_00,(DiagStackFrame **)&local_40);
      }
      JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_118);
      return;
    }
    bVar2 = JavascriptStackWalker::IsDisplayCaller(local_60);
    pJVar9 = local_60;
    if (bVar2) {
      if (local_31 == '\0') {
        bVar2 = JavascriptFunction::IsLibraryCode(local_60);
        if (!bVar2) goto LAB_007fc7a5;
      }
      else {
LAB_007fc7a5:
        this_02 = JavascriptStackWalker::GetCurrentInterpreterFrame
                            ((JavascriptStackWalker *)local_118);
        this_03 = JavascriptStackWalker::GetCurrentScriptContext((JavascriptStackWalker *)local_118)
        ;
        if (this_03 == (ScriptContext *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)walker.currentFrame.stackCheckCodeHeight = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                      ,0x74,"(frameScriptContext)","frameScriptContext");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)walker.currentFrame.stackCheckCodeHeight = 0;
        }
        if ((byte)local_38 == '\0') {
          bVar2 = ScriptContext::IsScriptContextInDebugMode(this_03);
          if ((!bVar2) &&
             ((this_01->
              super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
              count == 0)) {
            uVar10 = 0;
            goto LAB_007fc9b2;
          }
        }
        bVar2 = ScriptContext::IsScriptContextInDebugMode(this_03);
        if ((bVar2) && (((byte)local_38 == '\0' || (this_03 == local_58->pScriptContext)))) {
          if (this_02 == (InterpreterStackFrame *)0x0) {
            ppvVar7 = JavascriptStackWalker::GetCurrentArgv((JavascriptStackWalker *)local_118);
            if (local_50 != (void **)0x0 && ppvVar7 <= local_50) goto LAB_007fc97d;
            BVar4 = JavascriptFunction::IsScriptFunction(pJVar9);
            if (BVar4 == 0) {
              pDVar8 = (DiagNativeStackFrame *)new<Memory::ArenaAllocator>(0x28,local_48,0x35916e);
              displayName = JavascriptStackWalker::GetCurrentNativeLibraryEntryName
                                      ((JavascriptStackWalker *)local_118);
              DiagRuntimeStackFrame::DiagRuntimeStackFrame
                        ((DiagRuntimeStackFrame *)pDVar8,pJVar9,displayName,ppvVar7);
              local_40 = pDVar8;
            }
            else {
              pDVar8 = (DiagNativeStackFrame *)new<Memory::ArenaAllocator>(0x30,local_48,0x35916e);
              pJVar9 = JavascriptStackWalker::GetCurrentFunction
                                 ((JavascriptStackWalker *)local_118,true);
              function = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(pJVar9);
              byteCodeOffset =
                   JavascriptStackWalker::GetByteCodeOffset((JavascriptStackWalker *)local_118);
              codeAddr = JavascriptStackWalker::GetCurrentCodeAddr
                                   ((JavascriptStackWalker *)local_118);
              DiagNativeStackFrame::DiagNativeStackFrame
                        (pDVar8,function,byteCodeOffset,ppvVar7,codeAddr);
              local_40 = pDVar8;
            }
          }
          else {
            if (local_50 != (void **)0x0) {
              ppvVar7 = (void **)InterpreterStackFrame::GetStackAddress(this_02);
              if (ppvVar7 <= local_50) goto LAB_007fc97d;
            }
            pDVar8 = (DiagNativeStackFrame *)new<Memory::ArenaAllocator>(0x18,local_48,0x35916e);
            DiagInterpreterStackFrame::DiagInterpreterStackFrame
                      ((DiagInterpreterStackFrame *)pDVar8,this_02);
            local_40 = pDVar8;
          }
          JsUtil::
          List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(this_01,(DiagStackFrame **)&local_40);
        }
      }
LAB_007fc97d:
      sVar11 = sVar11 + 1;
    }
    uVar3 = 0;
    if (sVar11 != -1) {
      BVar4 = JavascriptStackWalker::GetCaller((JavascriptStackWalker *)local_118,&local_60,true);
      uVar3 = (uint)(BVar4 != 0);
    }
  } while( true );
}

Assistant:

void ProbeContainer::UpdateFramePointers(bool fMatchWithCurrentScriptContext, DWORD_PTR dispatchHaltFrameAddress)
    {
        ArenaAllocator* pDiagArena = debugManager->GetDiagnosticArena()->Arena();
        framePointers = Anew(pDiagArena, DiagStack, pDiagArena);

        JavascriptStackWalker walker(pScriptContext, !fMatchWithCurrentScriptContext, nullptr/*returnAddress*/, true/*forceFullWalk*/);
        DiagStack* tempFramePointers = Anew(pDiagArena, DiagStack, pDiagArena);
        const bool isLibraryFrameEnabledDebugger = IsLibraryStackFrameSupportEnabled();

        walker.WalkUntil([&](JavascriptFunction* func, ushort frameIndex) -> bool
        {
            if (isLibraryFrameEnabledDebugger || !func->IsLibraryCode())
            {
                DiagStackFrame* frm = nullptr;
                InterpreterStackFrame *interpreterFrame = walker.GetCurrentInterpreterFrame();
                ScriptContext* frameScriptContext = walker.GetCurrentScriptContext();
                Assert(frameScriptContext);

                if (!fMatchWithCurrentScriptContext && !frameScriptContext->IsScriptContextInDebugMode() && tempFramePointers->Count() == 0)
                {
                    // this means the top frame is not in the debug mode. We shouldn't be stopping for this break.
                    // This could happen if the exception happens on the diagnosticsScriptEngine.
                    return true;
                }

                // Ignore frames which are not in debug mode, which can happen when diag engine calls into user engine under debugger
                // -- topmost frame is under debugger but some frames could be in non-debug mode as they are from diag engine.
                if (frameScriptContext->IsScriptContextInDebugMode() &&
                    (!fMatchWithCurrentScriptContext || frameScriptContext == pScriptContext))
                {
                    if (interpreterFrame)
                    {
                        if (dispatchHaltFrameAddress == 0 || interpreterFrame->GetStackAddress() > dispatchHaltFrameAddress)
                        {
                            frm = Anew(pDiagArena, DiagInterpreterStackFrame, interpreterFrame);
                        }
                    }
                    else
                    {
                        void* stackAddress = walker.GetCurrentArgv();
                        if (dispatchHaltFrameAddress == 0 || reinterpret_cast<DWORD_PTR>(stackAddress) > dispatchHaltFrameAddress)
                        {
#if ENABLE_NATIVE_CODEGEN
                            if (func->IsScriptFunction())
                            {
                                frm = Anew(pDiagArena, DiagNativeStackFrame,
                                    VarTo<ScriptFunction>(walker.GetCurrentFunction()), walker.GetByteCodeOffset(), stackAddress, walker.GetCurrentCodeAddr());
                            }
                            else
#else
                            Assert(!func->IsScriptFunction());
#endif
                            {
                                frm = Anew(pDiagArena, DiagRuntimeStackFrame, func, walker.GetCurrentNativeLibraryEntryName(), stackAddress);
                            }
                        }
                    }
                }

                if (frm)
                {
                    tempFramePointers->Push(frm);
                }
            }

            return false;
        });

        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::UpdateFramePointers: detected %d frames (this=%p, fMatchWithCurrentScriptContext=%d)\n"),
            tempFramePointers->Count(), this, fMatchWithCurrentScriptContext);

        while (tempFramePointers->Count())
        {
            framePointers->Push(tempFramePointers->Pop());
        }
    }